

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O2

void Gia_ManMultiReport(Aig_Man_t *p,char *pStr,int nTotalPo,int nTotalSize,abctime clkStart)

{
  abctime aVar1;
  int level;
  int iVar2;
  
  printf("%3s : ");
  printf("PI =%6d  ",(ulong)(uint)p->nTruePis);
  printf("PO =%6d  ",(ulong)(uint)p->nTruePos);
  printf("FF =%7d  ",(ulong)(uint)p->nRegs);
  printf("ND =%7d  ",(ulong)(uint)(p->nObjs[6] + p->nObjs[5]));
  iVar2 = nTotalPo;
  if (nTotalPo < 2) {
    iVar2 = 1;
  }
  printf("Solved =%7d (%5.1f %%)  ",((double)(nTotalPo - p->nTruePos) * 100.0) / (double)iVar2);
  iVar2 = 1;
  if (1 < nTotalSize) {
    iVar2 = nTotalSize;
  }
  level = 0x7bded6;
  printf("Size   =%7d (%5.1f %%)  ",
         ((double)(p->vObjs->nSize - p->nDeleted) * 100.0) / (double)iVar2);
  aVar1 = Abc_Clock();
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(aVar1 - clkStart) / 1000000.0);
  return;
}

Assistant:

void Gia_ManMultiReport( Aig_Man_t * p, char * pStr, int nTotalPo, int nTotalSize, abctime clkStart )
{
    printf( "%3s : ", pStr );
    printf( "PI =%6d  ", Saig_ManPiNum(p) );
    printf( "PO =%6d  ", Saig_ManPoNum(p) );
    printf( "FF =%7d  ", Saig_ManRegNum(p) );
    printf( "ND =%7d  ", Aig_ManNodeNum(p) );
    printf( "Solved =%7d (%5.1f %%)  ", nTotalPo-Saig_ManPoNum(p), 100.0*(nTotalPo-Saig_ManPoNum(p))/Abc_MaxInt(1, nTotalPo) );
    printf( "Size   =%7d (%5.1f %%)  ", Aig_ManObjNum(p),          100.0*Aig_ManObjNum(p)/Abc_MaxInt(1, nTotalSize) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
}